

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

int __thiscall smf::MidiFile::makeVLV(MidiFile *this,uchar *buffer,int number)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  byte bVar9;
  
  if ((uint)number < 0x10000000) {
    *buffer = (uchar)((uint)number >> 0x15);
    buffer[1] = (byte)((uint)number >> 0xe) & 0x7f;
    buffer[2] = (byte)((uint)number >> 7) & 0x7f;
    buffer[3] = (byte)number & 0x7f;
    uVar8 = 4;
    bVar2 = false;
    uVar3 = 0xffffffff;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      bVar9 = buffer[lVar7];
      if (bVar9 != 0) {
        bVar2 = true;
      }
      if (bVar2) {
        bVar9 = bVar9 | 0x80;
        buffer[lVar7] = bVar9;
      }
      uVar1 = uVar8;
      if (-1 < (char)bVar9) {
        uVar1 = 0xffffffff;
      }
      if (uVar3 == 0xffffffff) {
        uVar3 = uVar1;
      }
      uVar8 = uVar8 - 1;
    }
    uVar8 = 1;
    if (uVar3 != 0xffffffff) {
      uVar8 = uVar3;
    }
    if ((int)uVar8 < 4) {
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar8) {
        uVar6 = (ulong)uVar8;
      }
      for (; uVar3 = uVar8, uVar6 != uVar5; uVar5 = uVar5 + 1) {
        buffer[uVar5] = buffer[(int)((4 - uVar8) + (int)uVar5)];
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Meta-message size too large to handle");
    std::endl<char,std::char_traits<char>>(poVar4);
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int MidiFile::makeVLV(uchar *buffer, int number) {

	unsigned long value = (unsigned long)number;

	if (value >= (1 << 28)) {
		std::cerr << "Error: Meta-message size too large to handle" << std::endl;
		buffer[0] = 0;
		buffer[1] = 0;
		buffer[2] = 0;
		buffer[3] = 0;
		return 1;
	}

	buffer[0] = (value >> 21) & 0x7f;
	buffer[1] = (value >> 14) & 0x7f;
	buffer[2] = (value >>  7) & 0x7f;
	buffer[3] = (value >>  0) & 0x7f;

	int i;
	int flag = 0;
	int length = -1;
	for (i=0; i<3; i++) {
		if (buffer[i] != 0) {
			flag = 1;
		}
		if (flag) {
			buffer[i] |= 0x80;
		}
		if (length == -1 && buffer[i] >= 0x80) {
			length = 4-i;
		}
	}

	if (length == -1) {
		length = 1;
	}

	if (length < 4) {
		for (i=0; i<length; i++) {
			buffer[i] = buffer[4-length+i];
		}
	}

	return length;
}